

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mwt.cc
# Opt level: O2

void MWT::predict_or_learn<false,false,true>(mwt *c,single_learner *base,example *ec)

{
  byte *pbVar1;
  unsigned_long *puVar2;
  unsigned_long uVar3;
  double dVar4;
  cb_class *pcVar5;
  unsigned_long *puVar6;
  policy_data *ppVar7;
  byte *pbVar8;
  v_array<unsigned_char> *__range3;
  v_array<float> preds;
  float local_5c;
  v_array<float> local_58;
  
  pcVar5 = get_observed_cost(&(ec->l).cb);
  c->observation = pcVar5;
  if (pcVar5 != (cb_class *)0x0) {
    c->total = c->total + 1.0;
    pbVar1 = (ec->super_example_predict).indices._end;
    for (pbVar8 = (ec->super_example_predict).indices._begin; pbVar8 != pbVar1; pbVar8 = pbVar8 + 1)
    {
      if (c->namespaces[*pbVar8] == true) {
        GD::foreach_feature<MWT::mwt,_&MWT::value_policy,_vw_*>
                  (&c->all,(ec->super_example_predict).feature_space + *pbVar8,c,0,1.0);
      }
    }
    puVar2 = (c->policies)._end;
    for (puVar6 = (c->policies)._begin; puVar6 != puVar2; puVar6 = puVar6 + 1) {
      uVar3 = *puVar6;
      ppVar7 = (c->evals)._begin;
      pcVar5 = c->observation;
      dVar4 = 0.0;
      if (pcVar5->action == ppVar7[uVar3].action) {
        dVar4 = (double)(pcVar5->cost / pcVar5->probability);
      }
      ppVar7 = ppVar7 + uVar3;
      ppVar7->cost = dVar4 + ppVar7->cost;
      (c->evals)._begin[uVar3].action = 0;
    }
  }
  local_58._begin = (ec->pred).scalars._begin;
  local_58._end = (ec->pred).scalars._end;
  local_58.end_array = (ec->pred).scalars.end_array;
  local_58.erase_count = (ec->pred).scalars.erase_count;
  v_array<float>::clear(&local_58);
  puVar2 = (c->policies)._end;
  for (puVar6 = (c->policies)._begin; puVar6 != puVar2; puVar6 = puVar6 + 1) {
    local_5c = (float)(c->evals)._begin[*puVar6].cost / (float)c->total;
    v_array<float>::push_back(&local_58,&local_5c);
  }
  (ec->pred).scalars.end_array = local_58.end_array;
  (ec->pred).scalars.erase_count = local_58.erase_count;
  (ec->pred).scalars._begin = local_58._begin;
  (ec->pred).scalars._end = local_58._end;
  return;
}

Assistant:

void predict_or_learn(mwt& c, single_learner& base, example& ec)
{
  c.observation = get_observed_cost(ec.l.cb);

  if (c.observation != nullptr)
  {
    c.total++;
    // For each nonzero feature in observed namespaces, check it's value.
    for (unsigned char ns : ec.indices)
      if (c.namespaces[ns])
        GD::foreach_feature<mwt, value_policy>(c.all, ec.feature_space[ns], c);
    for (uint64_t policy : c.policies)
    {
      c.evals[policy].cost += get_unbiased_cost(c.observation, c.evals[policy].action);
      c.evals[policy].action = 0;
    }
  }
  if (exclude || learn)
  {
    c.indices.clear();
    uint32_t stride_shift = c.all->weights.stride_shift();
    uint64_t weight_mask = c.all->weights.mask();
    for (unsigned char ns : ec.indices)
      if (c.namespaces[ns])
      {
        c.indices.push_back(ns);
        if (learn)
        {
          c.feature_space[ns].clear();
          for (features::iterator& f : ec.feature_space[ns])
          {
            uint64_t new_index = ((f.index() & weight_mask) >> stride_shift) * c.num_classes + (uint64_t)f.value();
            c.feature_space[ns].push_back(1, new_index << stride_shift);
          }
        }
        std::swap(c.feature_space[ns], ec.feature_space[ns]);
      }
  }

  // modify the predictions to use a vector with a score for each evaluated feature.
  v_array<float> preds = ec.pred.scalars;

  if (learn)
  {
    if (is_learn)
      base.learn(ec);
    else
      base.predict(ec);
  }

  if (exclude || learn)
    while (c.indices.size() > 0)
    {
      unsigned char ns = c.indices.pop();
      swap(c.feature_space[ns], ec.feature_space[ns]);
    }

  // modify the predictions to use a vector with a score for each evaluated feature.
  preds.clear();
  if (learn)
    preds.push_back((float)ec.pred.multiclass);
  for (uint64_t index : c.policies) preds.push_back((float)c.evals[index].cost / (float)c.total);

  ec.pred.scalars = preds;
}